

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

bool QMetaType::registerMutableViewImpl<QList<Qt::DayOfWeek>,QIterable<QMetaSequence>>
               (MutableViewFunction view,QMetaType fromType,QMetaType toType)

{
  bool bVar1;
  QMetaType in_RDX;
  
  bVar1 = registerMutableViewFunction((MutableViewFunction *)fromType.d_ptr,toType,in_RDX);
  if ((bVar1) &&
     (registerMutableViewImpl<QList<Qt::DayOfWeek>,QIterable<QMetaSequence>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)
      ::unregister == '\0')) {
    registerMutableViewImpl<QList<Qt::DayOfWeek>,QIterable<QMetaSequence>>();
  }
  return bVar1;
}

Assistant:

static bool registerMutableViewImpl(MutableViewFunction view, QMetaType fromType, QMetaType toType)
    {
        if (registerMutableViewFunction(std::move(view), fromType, toType)) {
            static const auto unregister = qScopeGuard([=] {
               unregisterMutableViewFunction(fromType, toType);
            });
            return true;
        } else {
            return false;
        }
    }